

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O2

int __thiscall
vkt::memory::anon_unknown_0::CreateImage::verify
          (CreateImage *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  int extraout_EAX;
  TextureFormat local_40;
  TextureLevel local_38;
  
  local_40.order = RGBA;
  local_40.type = UNORM_INT8;
  tcu::TextureLevel::TextureLevel(&local_38,&local_40,this->m_imageWidth,this->m_imageHeight,1);
  tcu::TextureLevel::operator=((TextureLevel *)(ctx + 0x48),&local_38);
  tcu::TextureLevel::~TextureLevel(&local_38);
  return extraout_EAX;
}

Assistant:

void CreateImage::verify (VerifyContext& context, size_t)
{
	context.getReferenceImage() = TextureLevel(TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8), m_imageWidth, m_imageHeight);
}